

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  test_number_parser();
  test_tokenizer();
  test_0();
  test_1();
  test_2();
  test_arithmetic();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
  test_number_parser();
  test_tokenizer();
  test_0();
  test_1();
  test_2();
  test_arithmetic();

  std::cout << "OK" << std::endl;
  return 0;
}